

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

size_t mg_parse_multipart(char *buf,size_t buf_len,char *var_name,size_t var_name_len,
                         char *file_name,size_t file_name_len,char **data,size_t *data_len)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  mg_str header;
  
  if ((((buf_len != 0 && buf != (char *)0x0) &&
       (iVar2 = get_request_len(buf,(int)buf_len), iVar2 != 0)) && (*buf == '-')) &&
     ((buf[1] == '-' && (buf[2] != '\n')))) {
    lVar5 = (long)iVar2;
    sVar3 = get_line_len(buf,buf_len);
    *file_name = '\0';
    *var_name = '\0';
    sVar6 = sVar3;
    while( true ) {
      pcVar1 = buf + sVar6;
      sVar4 = get_line_len(pcVar1,lVar5 - sVar6);
      if (sVar4 == 0) break;
      iVar2 = mg_ncasecmp("Content-Disposition: ",pcVar1,0x15);
      if (iVar2 == 0) {
        header.p = pcVar1 + 0x15;
        header.len = sVar4 - 0x17;
        mg_http_parse_header(&header,"name",var_name,var_name_len);
        mg_http_parse_header(&header,"filename",file_name,file_name_len);
      }
      sVar6 = sVar6 + sVar4;
    }
    pcVar1 = buf + lVar5;
    for (lVar7 = 0; lVar5 + sVar3 + -2 + lVar7 < buf_len; lVar7 = lVar7 + 1) {
      if ((pcVar1[lVar7] == '-') && (iVar2 = bcmp(buf,pcVar1 + lVar7,sVar3 - 2), iVar2 == 0)) {
        if (data_len != (size_t *)0x0) {
          *data_len = lVar7 - 2;
        }
        if (data == (char **)0x0) {
          return lVar5 + lVar7;
        }
        *data = pcVar1;
        return lVar5 + lVar7;
      }
    }
  }
  return 0;
}

Assistant:

size_t mg_parse_multipart(const char *buf, size_t buf_len, char *var_name,
                          size_t var_name_len, char *file_name,
                          size_t file_name_len, const char **data,
                          size_t *data_len) {
    static const char cd[] = "Content-Disposition: ";
    size_t hl, bl, n, ll, pos, cdl = sizeof(cd) - 1;

    if (buf == NULL || buf_len <= 0) return 0;
    if ((hl = get_request_len(buf, buf_len)) <= 0) return 0;
    if (buf[0] != '-' || buf[1] != '-' || buf[2] == '\n') return 0;

    /* Get boundary length */
    bl = get_line_len(buf, buf_len);

    /* Loop through headers, fetch variable name and file name */
    var_name[0] = file_name[0] = '\0';
    for (n = bl; (ll = get_line_len(buf + n, hl - n)) > 0; n += ll) {
        if (mg_ncasecmp(cd, buf + n, cdl) == 0) {
            struct mg_str header;
            header.p = buf + n + cdl;
            header.len = ll - (cdl + 2);
            mg_http_parse_header(&header, "name", var_name, var_name_len);
            mg_http_parse_header(&header, "filename", file_name, file_name_len);
        }
    }

    /* Scan through the body, search for terminating boundary */
    for (pos = hl; pos + (bl - 2) < buf_len; pos++) {
        if (buf[pos] == '-' && !memcmp(buf, &buf[pos], bl - 2)) {
            if (data_len != NULL) *data_len = (pos - 2) - hl;
            if (data != NULL) *data = buf + hl;
            return pos;
        }
    }

    return 0;
}